

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O3

bool MeCab::Dictionary::compile
               (Param *param,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics,char *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  int *piVar4;
  pointer ppVar5;
  size_type sVar6;
  Param *pPVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ostream *poVar14;
  POSIDGenerator *this;
  pointer pbVar15;
  unit_t *__s;
  long *plVar16;
  size_t sVar17;
  unit_t *puVar18;
  DecoderFeatureIndex *pDVar19;
  CharProperty *this_00;
  DictionaryRewriter *pDVar20;
  ContextID *p;
  Token *pTVar21;
  pointer ppVar22;
  _Rb_tree_header *p_Var23;
  Node *node_00;
  int extraout_EDX;
  int extraout_EDX_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  istringstream *piVar24;
  unit_t *puVar25;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
  *ppVar26;
  char *pcVar27;
  size_t key_size;
  unit_t *puVar28;
  unit_t *puVar29;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *pDVar30;
  long lVar31;
  long lVar32;
  char *tmpstr;
  unit_t *puVar33;
  ulong uVar34;
  string prev;
  vector<const_char_*,_std::allocator<const_char_*>_> str;
  int type;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  dic;
  vector<int,_std::allocator<int>_> val;
  vector<unsigned_long,_std::allocator<unsigned_long>_> len;
  scoped_ptr<MeCab::DictionaryRewriter> rewrite;
  uint lexsize;
  scoped_ptr<MeCab::ContextID> cid;
  string tbuf;
  char charset [32];
  Iconv config_iconv;
  uint version;
  uint fsize;
  uint tsize;
  uint dsize;
  uint rsize;
  uint lsize;
  uint dummy;
  Iconv iconv;
  string from;
  string fbuf;
  string dicdir;
  string config_charset;
  string node_format;
  string to;
  string right_id_file;
  string left_id_file;
  ofstream bofs;
  string rewrite_file;
  DoubleArray da;
  Node node;
  string pos_id_file;
  string matrix_bin_file;
  string matrix_file;
  Connector matrix;
  istringstream iss;
  DecoderFeatureIndex *local_9d0;
  StringBuffer *local_9c8;
  CharProperty *local_9c0;
  Writer *local_9b8;
  Lattice *local_9b0;
  ulong local_998;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
  local_990;
  string local_968;
  uint local_940;
  int local_93c;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  local_938;
  vector<int,_std::allocator<int>_> local_918;
  string local_8f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8d8;
  scoped_ptr<MeCab::DictionaryRewriter> local_8d0;
  int local_8bc;
  scoped_ptr<MeCab::ContextID> local_8b8;
  string local_8a8;
  string local_888;
  long local_868;
  Iconv local_860;
  int local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  int local_840;
  uint local_83c;
  uint local_838 [2];
  long local_830;
  Param *local_828;
  Iconv local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  undefined1 *local_7f0;
  undefined8 local_7e8;
  undefined1 local_7e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  char *local_7b0;
  ulong local_7a8;
  _func_int **local_7a0;
  _func_int **local_798;
  _func_int **local_790;
  _func_int **local_788;
  istringstream *local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  string local_718;
  string local_6f8;
  undefined1 local_6d8 [8];
  size_type sStack_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  byte abStack_6b8 [216];
  ios_base local_5e0 [280];
  string local_4c8;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> local_4a8;
  Node local_448;
  string local_3d0;
  string local_3b0;
  string local_390;
  Connector local_370;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_8d8 = dics;
  Connector::Connector(&local_370);
  local_8d0._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001400e0;
  local_8d0.ptr_ = (DictionaryRewriter *)0x0;
  local_8b8._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00140110;
  local_8b8.ptr_ = (ContextID *)0x0;
  Param::get<std::__cxx11::string>(&local_7d0,param,"dicdir");
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"matrix.def","");
  create_filename(&local_390,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"matrix.bin","");
  create_filename(&local_3b0,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"left-id.def","");
  create_filename(&local_6f8,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"right-id.def","");
  create_filename(&local_718,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"rewrite.def","");
  create_filename(&local_4c8,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"pos-id.def","");
  create_filename(&local_3d0,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_938.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_938.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
        *)0x0;
  local_938.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
        *)0x0;
  local_8bc = 0;
  local_7f0 = local_7e0;
  local_7e8 = 0;
  local_7e0[0] = 0;
  Param::get<std::__cxx11::string>(&local_810,param,"dictionary-charset");
  Param::get<std::__cxx11::string>(&local_738,param,"charset");
  bVar8 = Param::get<bool>(param,"wakati");
  local_93c = Param::get<int>(param,"type");
  Param::get<std::__cxx11::string>(&local_758,param,"node-format");
  iVar10 = Param::get<int>(param,"cost-factor");
  if (iVar10 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"factor > 0",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"cost factor needs to be positive value",0x26);
    die::~die((die *)local_6d8);
  }
  Param::get<std::__cxx11::string>(&local_778,param,"config-charset");
  if (local_778._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_778);
  }
  if (local_810._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!from.empty()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"input dictionary charset is empty",0x21);
    die::~die((die *)local_6d8);
  }
  if (local_738._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x119);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"!to.empty()",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"output dictionary charset is empty",0x22);
    die::~die((die *)local_6d8);
  }
  Iconv::Iconv(&local_820);
  iVar11 = Iconv::open(&local_820,local_810._M_dataplus._M_p,(int)local_738._M_dataplus._M_p);
  if ((char)iVar11 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"iconv.open(from.c_str(), to.c_str())",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"iconv_open() failed with from=",0x1e);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,local_810._M_dataplus._M_p,local_810._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," to=",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,local_738._M_dataplus._M_p,local_738._M_string_length);
    die::~die((die *)local_6d8);
  }
  local_828 = param;
  local_7b0 = output;
  Iconv::Iconv(&local_860);
  iVar11 = Iconv::open(&local_860,local_778._M_dataplus._M_p,(int)local_810._M_dataplus._M_p);
  if ((char)iVar11 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"config_iconv.open(config_charset.c_str(), from.c_str())",0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"iconv_open() failed with from=",0x1e);
    poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,local_778._M_dataplus._M_p,local_778._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," to=",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,local_810._M_dataplus._M_p,local_810._M_string_length);
    die::~die((die *)local_6d8);
  }
  if (local_758._M_string_length == 0) {
    local_9c8 = (StringBuffer *)0x0;
    local_9b0 = (Lattice *)0x0;
    local_9b8 = (Writer *)0x0;
  }
  else {
    local_9b8 = (Writer *)operator_new(0x200);
    Writer::Writer(local_9b8);
    local_9b0 = createLattice();
    local_9c8 = (StringBuffer *)operator_new(0x28);
    local_9c8->_vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_0013ffc0;
    local_9c8->size_ = 0;
    local_9c8->alloc_size_ = 0;
    local_9c8->ptr_ = (char *)0x0;
    local_9c8->is_delete_ = true;
    local_9c8->error_ = false;
    local_448.wcost = 0;
    local_448._98_6_ = 0;
    local_448.cost = 0;
    local_448.isbest = '\0';
    local_448._81_3_ = 0;
    local_448.alpha = 0.0;
    local_448.beta = 0.0;
    local_448.prob = 0.0;
    local_448.id = 0;
    local_448.length = 0;
    local_448.rlength = 0;
    local_448.rcAttr = 0;
    local_448.lcAttr = 0;
    local_448.posid = 0;
    local_448.char_type = '\0';
    local_448.stat = '\0';
    local_448.surface = (pointer)0x0;
    local_448.feature = (char *)0x0;
    local_448.rpath = (mecab_path_t *)0x0;
    local_448.lpath = (mecab_path_t *)0x0;
    local_448.enext = (mecab_node_t *)0x0;
    local_448.bnext = (mecab_node_t *)0x0;
    local_448.prev = (mecab_node_t *)0x0;
    local_448.next = (mecab_node_t *)0x0;
  }
  bVar9 = Connector::openText(&local_370,local_390._M_dataplus._M_p);
  if ((!bVar9) &&
     (iVar11 = Connector::open(&local_370,local_3b0._M_dataplus._M_p,0x130af8), (char)iVar11 == '\0'
     )) {
    local_370.lsize_ = 1;
    local_370.rsize_ = 1;
  }
  this = (POSIDGenerator *)operator_new(0x18);
  (this->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  POSIDGenerator::open(this,local_3d0._M_dataplus._M_p,(int)&local_860);
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6d8,"DEFAULT,0,0,0,*\nSPACE,0,0,0,*\n","");
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_6d8,_S_in);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  pbVar15 = (local_8d8->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((local_8d8->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar15) {
    local_9c0 = (CharProperty *)0x0;
    local_9d0 = (DecoderFeatureIndex *)0x0;
  }
  else {
    local_788 = (_func_int **)&PTR__ChunkFreeList_0013ff30;
    local_790 = (_func_int **)&PTR__ChunkFreeList_0013ff00;
    local_798 = (_func_int **)&PTR__StringBuffer_0013ffc0;
    local_7a0 = (_func_int **)&PTR_open_0013fe48;
    local_868 = 0;
    uVar34 = 0;
    local_9d0 = (DecoderFeatureIndex *)0x0;
    local_9c0 = (CharProperty *)0x0;
    local_850 = iVar10;
    do {
      piVar24 = (istringstream *)local_6d8;
      local_7a8 = uVar34;
      std::ifstream::ifstream(piVar24,pbVar15[uVar34]._M_dataplus._M_p,_S_in);
      if ((abStack_6b8[*(long *)((long)local_6d8 + -0x18)] & 5) != 0) {
        if (local_93c == 2) {
          pbVar15 = (local_8d8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pbVar15[uVar34]._M_dataplus._M_p,
                               pbVar15[uVar34]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," is not found. minimum setting is used.",0x27);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
          std::ostream::put((char)poVar14);
          std::ostream::flush();
          piVar24 = local_1b0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"ifs",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"no such file or directory: ",0x1b);
          pbVar15 = (local_8d8->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,pbVar15[uVar34]._M_dataplus._M_p,pbVar15[uVar34]._M_string_length);
          die::~die((die *)&local_4a8);
          piVar24 = (istringstream *)local_6d8;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      pbVar15 = (local_8d8->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pbVar15[uVar34]._M_dataplus._M_p,
                           pbVar15[uVar34]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," ... ",5);
      local_780 = piVar24;
      __s = (unit_t *)operator_new__(0x2000);
      local_830 = 0;
      while( true ) {
        piVar24 = local_780;
        std::ios::widen((char)*(undefined8 *)(*(long *)local_780 + -0x18) + (char)local_780);
        plVar16 = (long *)std::istream::getline((char *)piVar24,(long)__s,'\0');
        if ((*(byte *)((long)plVar16 + *(long *)(*plVar16 + -0x18) + 0x20) & 5) != 0) break;
        sVar17 = strlen((char *)__s);
        if ((sVar17 != 0) && (*(char *)((long)__s + (sVar17 - 1)) == '\r')) {
          *(char *)((long)__s + (sVar17 - 1)) = '\0';
        }
        sVar17 = strlen((char *)__s);
        if ((long)sVar17 < 1) {
LAB_00119108:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x158);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"n == 5",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"format error: ",0xe);
          sVar17 = strlen((char *)__s);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)__s,sVar17);
          die::~die((die *)&local_990);
        }
        else {
          puVar33 = (unit_t *)((long)&__s->base + sVar17);
          pDVar30 = &local_4a8;
          puVar29 = __s;
          lVar32 = 0;
          uVar34 = 5;
          do {
            for (; (lVar31 = lVar32, cVar2 = (char)puVar29->base, cVar2 == '\t' || (cVar2 == ' '));
                puVar29 = (unit_t *)((long)&puVar29->base + 1)) {
              lVar32 = lVar31;
            }
            if (cVar2 == '\"') {
              puVar29 = (unit_t *)((long)&puVar29->base + 1);
              puVar25 = puVar29;
              for (puVar18 = puVar29;
                  (puVar28 = puVar18, puVar18 < puVar33 &&
                  ((cVar2 = (char)puVar18->base, cVar2 != '\"' ||
                   (puVar28 = (unit_t *)((long)&puVar18->base + 1), piVar4 = &puVar18->base,
                   puVar18 = puVar28, *(char *)((long)piVar4 + 1) == '\"'))));
                  puVar18 = (unit_t *)((long)&puVar18->base + 1)) {
                *(char *)&puVar25->base = cVar2;
                puVar25 = (unit_t *)((long)&puVar25->base + 1);
              }
              local_990.first._M_dataplus._M_p._0_1_ = 0x2c;
              puVar18 = (unit_t *)
                        std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (puVar28,puVar33,&local_990);
            }
            else {
              local_990.first._M_dataplus._M_p._0_1_ = 0x2c;
              puVar18 = (unit_t *)
                        std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (puVar29,puVar33,&local_990);
              puVar25 = puVar18;
            }
            if (uVar34 < 2) {
              pDVar30->array_ = puVar29;
              if (uVar34 - 1 == 0) break;
            }
            else {
              *(char *)&puVar25->base = '\0';
              pDVar30->array_ = puVar29;
            }
            pDVar30 = (DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
                       *)&pDVar30->used_;
            puVar29 = (unit_t *)((long)&puVar18->base + 1);
            lVar32 = lVar31 + 1;
            uVar34 = uVar34 - 1;
          } while (puVar29 < puVar33);
          if (lVar31 != 4) goto LAB_00119108;
        }
        std::__cxx11::string::string
                  ((string *)&local_8a8,(char *)local_4a8.array_,(allocator *)&local_990);
        uVar13 = 0x7fffffff;
        uVar12 = 0x7fffffff;
        if ((local_4a8.used_ != (uchar *)0x0) && (*local_4a8.used_ != '\0')) {
          uVar12 = atoi((char *)local_4a8.used_);
        }
        if (((char *)local_4a8.size_ != (char *)0x0) && (*(char *)local_4a8.size_ != '\0')) {
          uVar13 = atoi((char *)local_4a8.size_);
        }
        iVar10 = 0x7fffffff;
        if (((char *)local_4a8.alloc_size_ != (char *)0x0) &&
           (*(char *)local_4a8.alloc_size_ != '\0')) {
          iVar10 = atoi((char *)local_4a8.alloc_size_);
        }
        std::__cxx11::string::string
                  ((string *)&local_888,(char *)local_4a8.key_,(allocator *)&local_990);
        iVar11 = POSIDGenerator::id(this,local_888._M_dataplus._M_p);
        if (iVar10 == 0x7fffffff) {
          if (local_93c != 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                       ,0x70);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x162);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"type == MECAB_USR_DIC",0x15)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"cost field should not be empty in sys/unk dic.",0x2e);
            die::~die((die *)&local_990);
          }
          if (local_8d0.ptr_ == (DictionaryRewriter *)0x0) {
            pDVar20 = (DictionaryRewriter *)operator_new(0x78);
            p_Var23 = &(pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pDVar20->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var23->_M_header;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var23->_M_header;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            scoped_ptr<MeCab::DictionaryRewriter>::reset(&local_8d0,pDVar20);
            DictionaryRewriter::open(local_8d0.ptr_,local_4c8._M_dataplus._M_p,(int)&local_860);
            pDVar19 = (DecoderFeatureIndex *)operator_new(0x378);
            (pDVar19->super_FeatureIndex).feature_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar19->super_FeatureIndex).feature_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar19->super_FeatureIndex).feature_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar19->super_FeatureIndex).feature_freelist_._vptr_ChunkFreeList = local_788;
            (pDVar19->super_FeatureIndex).feature_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar19->super_FeatureIndex).feature_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar19->super_FeatureIndex).feature_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar19->super_FeatureIndex).feature_freelist_.pi_ = 0;
            (pDVar19->super_FeatureIndex).feature_freelist_.li_ = 0;
            (pDVar19->super_FeatureIndex).feature_freelist_.default_size = 0x40000;
            (pDVar19->super_FeatureIndex).char_freelist_._vptr_ChunkFreeList = local_790;
            (pDVar19->super_FeatureIndex).char_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar19->super_FeatureIndex).char_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar19->super_FeatureIndex).char_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar19->super_FeatureIndex).char_freelist_.pi_ = 0;
            (pDVar19->super_FeatureIndex).char_freelist_.li_ = 0;
            (pDVar19->super_FeatureIndex).char_freelist_.default_size = 0x40000;
            p_Var23 = &(pDVar19->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.
                       super__Rb_tree_header;
            (pDVar19->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_color = _S_red;
            (pDVar19->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_parent = (_Base_ptr)0x0;
            (pDVar19->super_FeatureIndex).unigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar19->super_FeatureIndex).unigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar19->super_FeatureIndex).unigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar19->super_FeatureIndex).bigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar19->super_FeatureIndex).bigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar19->super_FeatureIndex).bigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.unigram_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.unigram_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.unigram_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.left_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.left_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.left_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.right_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.right_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.right_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar19->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_left = &p_Var23->_M_header;
            (pDVar19->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_right = &p_Var23->_M_header;
            (pDVar19->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_node_count = 0;
            (pDVar19->super_FeatureIndex).os_._vptr_StringBuffer = local_798;
            (pDVar19->super_FeatureIndex).os_.size_ = 0;
            (pDVar19->super_FeatureIndex).os_.alloc_size_ = 0;
            (pDVar19->super_FeatureIndex).os_.ptr_ = (char *)0x0;
            (pDVar19->super_FeatureIndex).os_.is_delete_ = true;
            (pDVar19->super_FeatureIndex).os_.error_ = false;
            (pDVar19->super_FeatureIndex).maxid_ = 0;
            (pDVar19->super_FeatureIndex).alpha_ = (double *)0x0;
            (pDVar19->super_FeatureIndex)._vptr_FeatureIndex = local_7a0;
            Mmap<char>::Mmap(&pDVar19->mmap_);
            pPVar7 = local_828;
            (pDVar19->model_buffer_)._M_dataplus._M_p = (pointer)&(pDVar19->model_buffer_).field_2;
            (pDVar19->model_buffer_)._M_string_length = 0;
            (pDVar19->model_buffer_).field_2._M_local_buf[0] = '\0';
            if (local_9d0 != (DecoderFeatureIndex *)0x0) {
              (*(local_9d0->super_FeatureIndex)._vptr_FeatureIndex[5])();
            }
            iVar10 = (**(pDVar19->super_FeatureIndex)._vptr_FeatureIndex)(pDVar19,pPVar7);
            if ((char)iVar10 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x168);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"fi->open(param)",0xf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"cannot open feature index",0x19);
              die::~die((die *)&local_990);
            }
            this_00 = (CharProperty *)operator_new(0x1d8);
            CharProperty::CharProperty(this_00);
            iVar10 = extraout_EDX;
            if (local_9c0 != (CharProperty *)0x0) {
              (*local_9c0->_vptr_CharProperty[1])();
              iVar10 = extraout_EDX_00;
            }
            iVar10 = CharProperty::open(this_00,(char *)local_828,iVar10);
            if ((char)iVar10 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x16a);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"property->open(param)",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
              die::~die((die *)&local_990);
            }
            CharProperty::set_charset(this_00,local_810._M_dataplus._M_p);
            local_9c0 = this_00;
            local_9d0 = pDVar19;
          }
          iVar10 = anon_unknown_0::calcCost
                             (&local_8a8,&local_888,local_850,local_9d0,local_8d0.ptr_,local_9c0);
        }
        if (((uVar13 == 0x7fffffff) || (uVar12 == 0x7fffffff)) || ((int)(uVar13 | uVar12) < 0)) {
          if (local_8d0.ptr_ == (DictionaryRewriter *)0x0) {
            pDVar20 = (DictionaryRewriter *)operator_new(0x78);
            p_Var23 = &(pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pDVar20->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var23->_M_header;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var23->_M_header;
            (pDVar20->cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            scoped_ptr<MeCab::DictionaryRewriter>::reset(&local_8d0,pDVar20);
            DictionaryRewriter::open(local_8d0.ptr_,local_4c8._M_dataplus._M_p,(int)&local_860);
          }
          local_990.first._M_dataplus._M_p = (pointer)&local_990.first.field_2;
          local_990.first._M_string_length = 0;
          local_990.first.field_2._M_local_buf[0] = '\0';
          local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
          local_968._M_string_length = 0;
          local_968.field_2._M_allocated_capacity =
               local_968.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_8f8._M_dataplus._M_p = (pointer)&local_8f8.field_2;
          local_8f8._M_string_length = 0;
          local_8f8.field_2._M_allocated_capacity =
               local_8f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
          bVar9 = DictionaryRewriter::rewrite
                            (local_8d0.ptr_,&local_888,&local_990.first,&local_968,&local_8f8);
          if (!bVar9) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                       ,0x70);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x178);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"rewrite->rewrite(feature, &ufeature, &lfeature, &rfeature)",0x3a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"rewrite failed: ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,local_888._M_dataplus._M_p,local_888._M_string_length);
            die::~die((die *)&local_918);
          }
          if (local_8b8.ptr_ == (ContextID *)0x0) {
            p = (ContextID *)operator_new(0xa0);
            p_Var23 = &(p->left_)._M_t._M_impl.super__Rb_tree_header;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var23->_M_header;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var23->_M_header;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            p_Var23 = &(p->right_)._M_t._M_impl.super__Rb_tree_header;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var23->_M_header;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var23->_M_header;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            (p->left_bos_)._M_dataplus._M_p = (pointer)&(p->left_bos_).field_2;
            (p->left_bos_)._M_string_length = 0;
            (p->left_bos_).field_2._M_local_buf[0] = '\0';
            (p->right_bos_)._M_dataplus._M_p = (pointer)&(p->right_bos_).field_2;
            (p->right_bos_)._M_string_length = 0;
            (p->right_bos_).field_2._M_local_buf[0] = '\0';
            scoped_ptr<MeCab::ContextID>::reset(&local_8b8,p);
            ContextID::open(local_8b8.ptr_,local_6f8._M_dataplus._M_p,
                            (int)local_718._M_dataplus._M_p,&local_860);
            if ((((local_8b8.ptr_)->left_)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                 (ulong)local_370.lsize_) ||
               (((local_8b8.ptr_)->right_)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                (ulong)local_370.rsize_)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x180);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,
                         "cid->left_size() == matrix.left_size() && cid->right_size() == matrix.right_size()"
                         ,0x52);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"Context ID files(",0x11);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_6f8._M_dataplus._M_p,local_6f8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," or ",4);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_718._M_dataplus._M_p,local_718._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," may be broken",0xe);
              die::~die((die *)&local_918);
            }
          }
          uVar12 = ContextID::lid(local_8b8.ptr_,local_968._M_dataplus._M_p);
          uVar13 = ContextID::rid(local_8b8.ptr_,local_8f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_8f8._M_dataplus._M_p != &local_8f8.field_2) {
            operator_delete(local_8f8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_968._M_dataplus._M_p != &local_968.field_2) {
            operator_delete(local_968._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_990.first._M_dataplus._M_p != &local_990.first.field_2) {
            operator_delete(local_990.first._M_dataplus._M_p);
          }
          if (-1 < (int)(uVar13 | uVar12)) goto LAB_00119afc;
LAB_00119b19:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x18b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid)",0x31);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"invalid ids are found lid=",0x1a);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,uVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," rid=",5);
          std::ostream::operator<<((ostream *)poVar14,uVar13);
          die::~die((die *)&local_990);
        }
        else {
LAB_00119afc:
          if (((uint)local_370._32_4_ >> 0x10 <= uVar12) || ((local_370._32_4_ & 0xffff) <= uVar13))
          goto LAB_00119b19;
        }
        if (local_8a8._M_string_length == 0) {
          lVar32 = 0x26;
          pcVar27 = "empty word is found, discard this line";
LAB_0011a0d7:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar27,lVar32);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
          std::ostream::put(-0x58);
          std::ostream::flush();
        }
        else {
          bVar9 = Iconv::convert(&local_820,&local_888);
          lVar32 = 0x28;
          if (!bVar9) {
            pcVar27 = "iconv conversion failed. skip this entry";
            goto LAB_0011a0d7;
          }
          if (local_93c != 2) {
            bVar9 = Iconv::convert(&local_820,&local_8a8);
            pcVar27 = "iconv conversion failed. skip this entry";
            if (!bVar9) goto LAB_0011a0d7;
          }
          if (local_758._M_string_length != 0) {
            local_448.surface = local_8a8._M_dataplus._M_p;
            local_448.feature = local_888._M_dataplus._M_p;
            local_448.length = (unsigned_short)local_8a8._M_string_length;
            local_448.rlength = (unsigned_short)local_8a8._M_string_length;
            local_448.posid = (unsigned_short)iVar11;
            local_448._72_8_ = local_448._72_8_ & 0xffffffffffffff;
            (*local_9b0->_vptr_Lattice[9])();
            if (local_9c8 == (StringBuffer *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1a7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"os.get()",8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
              die::~die((die *)&local_990);
            }
            if (local_9b8 == (Writer *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"writer.get()",0xc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
              die::~die((die *)&local_990);
            }
            local_9c8->size_ = 0;
            node_00 = &local_448;
            bVar9 = Writer::writeNode(local_9b8,local_9b0,local_758._M_dataplus._M_p,node_00,
                                      local_9c8);
            __buf = extraout_RDX;
            if (!bVar9) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1ac);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,
                         "writer->writeNode(lattice.get(), node_format.c_str(), &node, &*os)",0x42);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"conversion error: ",0x12);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,local_888._M_dataplus._M_p,local_888._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," with ",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,local_758._M_dataplus._M_p,local_758._M_string_length);
              die::~die((die *)&local_990);
              __buf = extraout_RDX_00;
            }
            StringBuffer::write(local_9c8,0,__buf,(size_t)node_00);
            sVar6 = local_888._M_string_length;
            pcVar27 = (char *)0x0;
            if (local_9c8->error_ == false) {
              pcVar27 = local_9c8->ptr_;
            }
            strlen(pcVar27);
            std::__cxx11::string::_M_replace((ulong)&local_888,0,(char *)sVar6,(ulong)pcVar27);
          }
          local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
          local_968._M_string_length = 0;
          local_968.field_2._M_allocated_capacity =
               local_968.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if (!bVar8) {
            local_990.first._M_dataplus._M_p = (pointer)&local_990.first.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_990,local_888._M_dataplus._M_p,
                       (char *)(local_888._M_string_length + (long)local_888._M_dataplus._M_p));
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_990,local_990.first._M_string_length,0,'\x01');
            std::__cxx11::string::operator=((string *)&local_968,(string *)&local_990);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_990.first._M_dataplus._M_p != &local_990.first.field_2) {
              operator_delete(local_990.first._M_dataplus._M_p);
            }
          }
          pTVar21 = (Token *)operator_new(0x10);
          pTVar21->lcAttr = (unsigned_short)uVar12;
          pTVar21->rcAttr = (unsigned_short)uVar13;
          pTVar21->posid = (unsigned_short)iVar11;
          pTVar21->wcost = (short)iVar10;
          pTVar21->feature = (uint)local_868;
          pTVar21->compound = 0;
          local_990.first._M_dataplus._M_p = (pointer)&local_990.first.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_990,local_8a8._M_dataplus._M_p,
                     local_8a8._M_dataplus._M_p + local_8a8._M_string_length);
          local_990.second = pTVar21;
          std::
          vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>
          ::emplace_back<std::pair<std::__cxx11::string,MeCab::Token*>>
                    ((vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>
                      *)&local_938,&local_990);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_990.first._M_dataplus._M_p != &local_990.first.field_2) {
            operator_delete(local_990.first._M_dataplus._M_p);
          }
          if (!bVar8) {
            std::__cxx11::string::append((char *)&local_7f0,(ulong)local_968._M_dataplus._M_p);
          }
          local_8bc = local_8bc + 1;
          local_868 = local_868 + local_968._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_968._M_dataplus._M_p != &local_968.field_2) {
            operator_delete(local_968._M_dataplus._M_p);
          }
          local_830 = local_830 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_888._M_dataplus._M_p != &local_888.field_2) {
          operator_delete(local_888._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
          operator_delete(local_8a8._M_dataplus._M_p);
        }
      }
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      operator_delete__(__s);
      std::ifstream::~ifstream(local_6d8);
      uVar34 = local_7a8 + 1;
      pbVar15 = (local_8d8->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar34 < (ulong)((long)(local_8d8->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar15 >> 5
                             ));
  }
  if (bVar8) {
    std::__cxx11::string::append((char *)&local_7f0,0x131e00);
  }
  ppVar22 = local_938.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_938.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_938.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar32 = ((long)local_938.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_938.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
                         *)local_6d8,
                        (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>
                         )local_938.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar32 - (lVar32 + 1 >> 0x3f)) + 1 >> 1);
    if (local_6c8._M_allocated_capacity == 0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,MeCab::Token*>*,std::vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<MeCab::(anonymous_namespace)::pair_1st_cmp<std::__cxx11::string,MeCab::Token*>>>
                (ppVar22);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,MeCab::Token*>*,std::vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>>,std::pair<std::__cxx11::string,MeCab::Token*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<MeCab::(anonymous_namespace)::pair_1st_cmp<std::__cxx11::string,MeCab::Token*>>>
                (ppVar22);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
                *)local_6d8);
    ppVar22 = local_938.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  local_990.first._M_dataplus._M_p = (pointer)&local_990.first.field_2;
  local_990.first._M_string_length = 0;
  local_990.first.field_2._M_local_buf[0] = '\0';
  local_968.field_2._M_allocated_capacity = 0;
  local_968._M_dataplus._M_p = (pointer)0x0;
  local_968._M_string_length = 0;
  local_8f8.field_2._M_allocated_capacity = 0;
  local_8f8._M_dataplus._M_p = (pointer)0x0;
  local_8f8._M_string_length = 0;
  local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (value_type_conflict1 *)0x0;
  local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  if (ppVar22 ==
      local_938.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_6d8 = (undefined1  [8])
                ((local_938.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus._M_p;
    local_998 = 0;
    iVar10 = 0;
  }
  else {
    lVar32 = 0;
    uVar34 = 0;
    local_998 = 0;
    iVar10 = 0;
    do {
      ppVar22 = local_938.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar34 == 0) ||
         ((local_990.first._M_string_length ==
           *(size_t *)
            ((long)&((local_938.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first)._M_string_length + lVar32)
          && ((local_990.first._M_string_length == 0 ||
              (iVar11 = bcmp(local_990.first._M_dataplus._M_p,
                             *(void **)((long)&((local_938.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first).
                                               _M_dataplus._M_p + lVar32),
                             local_990.first._M_string_length), iVar11 == 0)))))) {
        iVar10 = iVar10 + 1;
      }
      else {
        local_6d8 = (undefined1  [8])ppVar22[local_998].first._M_dataplus._M_p;
        if (local_968._M_string_length == local_968.field_2._M_allocated_capacity) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_968,
                     (iterator)local_968._M_string_length,(char **)local_6d8);
        }
        else {
          *(undefined1 (*) [8])local_968._M_string_length = local_6d8;
          local_968._M_string_length = local_968._M_string_length + 8;
        }
        local_6d8 = (undefined1  [8])
                    local_938.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_998].first._M_string_length;
        if (local_8f8._M_string_length == local_8f8.field_2._M_allocated_capacity) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_8f8,
                     (iterator)local_8f8._M_string_length,(unsigned_long *)local_6d8);
        }
        else {
          *(undefined1 (*) [8])local_8f8._M_string_length = local_6d8;
          local_8f8._M_string_length = local_8f8._M_string_length + 8;
        }
        iVar10 = iVar10 + (int)local_998 * 0x100;
        local_6d8._0_4_ = iVar10;
        if (local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_918,
                     (iterator)
                     local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_6d8);
        }
        else {
          *local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar10;
          local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar10 = 1;
        local_998 = uVar34;
      }
      std::__cxx11::string::_M_assign((string *)&local_990);
      uVar34 = uVar34 + 1;
      lVar32 = lVar32 + 0x28;
    } while (uVar34 < (ulong)(((long)local_938.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_938.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
    local_6d8 = (undefined1  [8])
                local_938.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start[local_998].first._M_dataplus._M_p;
    if (local_968._M_string_length != local_968.field_2._M_allocated_capacity) {
      *(undefined1 (*) [8])local_968._M_string_length = local_6d8;
      local_968._M_string_length = local_968._M_string_length + 8;
      goto LAB_0011a4cc;
    }
  }
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_968,
             (iterator)local_968._M_string_length,(char **)local_6d8);
LAB_0011a4cc:
  local_6d8 = (undefined1  [8])
              local_938.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_998].first._M_string_length;
  if (local_8f8._M_string_length == local_8f8.field_2._M_allocated_capacity) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_8f8,
               (iterator)local_8f8._M_string_length,(unsigned_long *)local_6d8);
  }
  else {
    *(undefined1 (*) [8])local_8f8._M_string_length = local_6d8;
    local_8f8._M_string_length = local_8f8._M_string_length + 8;
  }
  iVar10 = iVar10 + (int)local_998 * 0x100;
  local_6d8._0_4_ = iVar10;
  if (local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_918,
               (iterator)
               local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_6d8);
  }
  else {
    *local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = iVar10;
    local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  lVar32 = local_968._M_string_length - (long)local_968._M_dataplus._M_p;
  if (lVar32 != local_8f8._M_string_length - (long)local_8f8._M_dataplus._M_p) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1eb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"str.size() == len.size()",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    die::~die((die *)local_6d8);
    lVar32 = local_968._M_string_length - (long)local_968._M_dataplus._M_p;
  }
  key_size = lVar32 >> 3;
  if (key_size !=
      (long)local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start >> 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1ec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"str.size() == val.size()",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    die::~die((die *)local_6d8);
    key_size = (long)(local_968._M_string_length - (long)local_968._M_dataplus._M_p) >> 3;
  }
  local_4a8.no_delete_ = false;
  local_4a8.error_ = 0;
  local_4a8.array_ = (unit_t *)0x0;
  local_4a8.used_ = (uchar *)0x0;
  local_4a8.size_ = 0;
  local_4a8.alloc_size_ = 0;
  iVar10 = Darts::
           DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
           build(&local_4a8,key_size,(key_type_conflict **)local_968._M_dataplus._M_p,
                 (size_t *)local_8f8._M_dataplus._M_p,
                 local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,anon_unknown_0::progress_bar_darts);
  if (iVar10 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,
               "da.build(str.size(), const_cast<char **>(&str[0]), &len[0], &val[0], &progress_bar_darts) == 0"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"unkown error in building double-array",0x25);
    die::~die((die *)local_6d8);
  }
  paVar1 = &local_8a8.field_2;
  local_8a8._M_string_length = 0;
  local_8a8.field_2._M_local_buf[0] = '\0';
  local_8a8._M_dataplus._M_p = (pointer)paVar1;
  if (local_938.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_938.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar32 = 0x20;
    uVar34 = 0;
    do {
      std::__cxx11::string::append
                ((char *)&local_8a8,
                 *(ulong *)((long)&((local_938.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + lVar32));
      operator_delete(*(void **)((long)&((local_938.
                                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->first).
                                        _M_dataplus._M_p + lVar32));
      uVar34 = uVar34 + 1;
      lVar32 = lVar32 + 0x28;
    } while (uVar34 < (ulong)(((long)local_938.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_938.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
  }
  pcVar27 = local_7b0;
  ppVar5 = local_938.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar22 = local_938.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar26 = local_938.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_938.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_938.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar3 = (ppVar26->first)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &(ppVar26->first).field_2) {
        operator_delete(pcVar3);
      }
      ppVar26 = ppVar26 + 1;
    } while (ppVar26 != ppVar5);
    local_938.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar22;
  }
  local_844 = (undefined4)local_8a8._M_string_length;
  if ((local_8a8._M_string_length & 7) != 0) {
    do {
      local_6d8 = (undefined1  [8])0x0;
      sStack_6d0 = 0;
      std::__cxx11::string::append((char *)&local_8a8,(ulong)local_6d8);
      local_844 = (undefined4)local_8a8._M_string_length;
    } while ((local_8a8._M_string_length & 7) != 0);
  }
  local_838[1] = 0;
  local_838[0] = local_370._32_4_ & 0xffff;
  local_83c = (uint)local_370._32_4_ >> 0x10;
  local_840 = (int)local_4a8.size_ << 3;
  local_848 = (undefined4)local_7e8;
  local_84c = 0x66;
  local_888.field_2._M_allocated_capacity = 0;
  local_888.field_2._8_8_ = 0;
  local_888._M_dataplus._M_p = (pointer)0x0;
  local_888._M_string_length = 0;
  strncpy((char *)&local_888,local_738._M_dataplus._M_p,0x1f);
  std::ofstream::ofstream(local_6d8,pcVar27,_S_out|_S_bin);
  if ((abStack_6b8[*(long *)((long)local_6d8 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x20f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"bofs",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"permission denied: ",0x13);
    if (pcVar27 == (char *)0x0) {
      std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
    }
    else {
      sVar17 = strlen(pcVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar27,sVar17);
    }
    die::~die((die *)&local_940);
  }
  local_940 = 0;
  std::ostream::write(local_6d8,(long)&local_940);
  std::ostream::write(local_6d8,(long)&local_84c);
  std::ostream::write(local_6d8,(long)&local_93c);
  std::ostream::write(local_6d8,(long)&local_8bc);
  std::ostream::write(local_6d8,(long)local_838);
  std::ostream::write(local_6d8,(long)&local_83c);
  std::ostream::write(local_6d8,(long)&local_840);
  std::ostream::write(local_6d8,(long)&local_844);
  std::ostream::write(local_6d8,(long)&local_848);
  std::ostream::write(local_6d8,(long)(local_838 + 1));
  std::ostream::write(local_6d8,(long)&local_888);
  std::ostream::write(local_6d8,(long)local_4a8.array_);
  std::ostream::write(local_6d8,(long)local_8a8._M_dataplus._M_p);
  std::ostream::write(local_6d8,(long)local_7f0);
  local_940 = std::ostream::tellp();
  local_940 = local_940 ^ 0xef718f77;
  std::ostream::seekp(local_6d8,0,0);
  std::ostream::write(local_6d8,(long)&local_940);
  std::ofstream::close();
  local_6d8 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_6d8 + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)&sStack_6d0);
  std::ios_base::~ios_base(local_5e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8a8._M_dataplus._M_p);
  }
  Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::clear
            (&local_4a8);
  if (local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (value_type_conflict1 *)0x0) {
    operator_delete(local_918.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((size_t *)local_8f8._M_dataplus._M_p != (size_t *)0x0) {
    operator_delete(local_8f8._M_dataplus._M_p);
  }
  if ((key_type_conflict **)local_968._M_dataplus._M_p != (key_type_conflict **)0x0) {
    operator_delete(local_968._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990.first._M_dataplus._M_p != &local_990.first.field_2) {
    operator_delete(local_990.first._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  Iconv::~Iconv(&local_860);
  Iconv::~Iconv(&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if (local_7f0 != local_7e0) {
    operator_delete(local_7f0);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ::~vector(&local_938);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  if (local_9c0 != (CharProperty *)0x0) {
    (*local_9c0->_vptr_CharProperty[1])();
  }
  if (local_9c8 != (StringBuffer *)0x0) {
    (*local_9c8->_vptr_StringBuffer[1])();
  }
  if (local_9b0 != (Lattice *)0x0) {
    (*local_9b0->_vptr_Lattice[0x27])();
  }
  if (local_9b8 != (Writer *)0x0) {
    (*local_9b8->_vptr_Writer[1])();
  }
  scoped_ptr<MeCab::ContextID>::~scoped_ptr(&local_8b8);
  if (local_9d0 != (DecoderFeatureIndex *)0x0) {
    (*(local_9d0->super_FeatureIndex)._vptr_FeatureIndex[5])();
  }
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
            ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)this);
  operator_delete(this);
  scoped_ptr<MeCab::DictionaryRewriter>::~scoped_ptr(&local_8d0);
  Connector::~Connector(&local_370);
  return true;
}

Assistant:

bool Dictionary::compile(const Param &param,
                         const std::vector<std::string> &dics,
                         const char *output) {
  Connector matrix;
  scoped_ptr<DictionaryRewriter> rewrite;
  scoped_ptr<POSIDGenerator> posid;
  scoped_ptr<DecoderFeatureIndex> fi;
  scoped_ptr<ContextID> cid;
  scoped_ptr<Writer> writer;
  scoped_ptr<Lattice> lattice;
  scoped_ptr<StringBuffer> os;
  scoped_ptr<CharProperty> property;
  Node node;

  const std::string dicdir = param.get<std::string>("dicdir");

  const std::string matrix_file     = DCONF(MATRIX_DEF_FILE);
  const std::string matrix_bin_file = DCONF(MATRIX_FILE);
  const std::string left_id_file    = DCONF(LEFT_ID_FILE);
  const std::string right_id_file   = DCONF(RIGHT_ID_FILE);
  const std::string rewrite_file    = DCONF(REWRITE_FILE);
  const std::string pos_id_file     = DCONF(POS_ID_FILE);

  std::vector<std::pair<std::string, Token*> > dic;

  size_t offset  = 0;
  unsigned int lexsize = 0;
  std::string fbuf;

  const std::string from = param.get<std::string>("dictionary-charset");
  const std::string to = param.get<std::string>("charset");
  const bool wakati = param.get<bool>("wakati");
  const int type = param.get<int>("type");
  const std::string node_format = param.get<std::string>("node-format");
  const int factor = param.get<int>("cost-factor");
  CHECK_DIE(factor > 0)   << "cost factor needs to be positive value";

  // for backward compatibility
  std::string config_charset = param.get<std::string>("config-charset");
  if (config_charset.empty()) {
    config_charset = from;
  }

  CHECK_DIE(!from.empty()) << "input dictionary charset is empty";
  CHECK_DIE(!to.empty())   << "output dictionary charset is empty";

  Iconv iconv;
  CHECK_DIE(iconv.open(from.c_str(), to.c_str()))
      << "iconv_open() failed with from=" << from << " to=" << to;

  Iconv config_iconv;
  CHECK_DIE(config_iconv.open(config_charset.c_str(), from.c_str()))
      << "iconv_open() failed with from=" << config_charset << " to=" << from;

  if (!node_format.empty()) {
    writer.reset(new Writer);
    lattice.reset(createLattice());
    os.reset(new StringBuffer);
    memset(&node, 0, sizeof(node));
  }

  if (!matrix.openText(matrix_file.c_str()) &&
      !matrix.open(matrix_bin_file.c_str())) {
    matrix.set_left_size(1);
    matrix.set_right_size(1);
  }

  posid.reset(new POSIDGenerator);
  posid->open(pos_id_file.c_str(), &config_iconv);

  std::istringstream iss(UNK_DEF_DEFAULT);

  for (size_t i = 0; i < dics.size(); ++i) {
    std::ifstream ifs(WPATH(dics[i].c_str()));
    std::istream *is = &ifs;
    if (!ifs) {
      if (type == MECAB_UNK_DIC) {
        std::cerr << dics[i]
                  << " is not found. minimum setting is used." << std::endl;
        is = &iss;
      } else {
        CHECK_DIE(ifs) << "no such file or directory: " << dics[i];
      }
    }

    std::cout << "reading " << dics[i] << " ... ";

    scoped_fixed_array<char, BUF_SIZE> line;
    size_t num = 0;

    while (is->getline(line.get(), line.size())) {
#if 1 /* for Open JTalk */
      {
        /* if there is CR code, it should be removed */
        char *tmpstr = line.get();
        if(tmpstr != NULL){
          size_t tmplen = strlen(tmpstr);
          if(tmplen > 0){
            if(tmpstr[tmplen-1] == '\r'){
              tmpstr[tmplen-1] = '\0';
            }
          }
        }
      }
#endif
      char *col[8];
      const size_t n = tokenizeCSV(line.get(), col, 5);
      CHECK_DIE(n == 5) << "format error: " << line.get();

      std::string w = col[0];
      int lid = toInt(col[1]);
      int rid = toInt(col[2]);
      int cost = toInt(col[3]);
      std::string feature = col[4];
      const int pid = posid->id(feature.c_str());

      if (cost == INT_MAX) {
        CHECK_DIE(type == MECAB_USR_DIC)
            << "cost field should not be empty in sys/unk dic.";
        if (!rewrite.get()) {
          rewrite.reset(new DictionaryRewriter);
          rewrite->open(rewrite_file.c_str(), &config_iconv);
          fi.reset(new DecoderFeatureIndex);
          CHECK_DIE(fi->open(param)) << "cannot open feature index";
          property.reset(new CharProperty);
          CHECK_DIE(property->open(param));
          property->set_charset(from.c_str());
        }
        cost = calcCost(w, feature, factor,
                        fi.get(), rewrite.get(), property.get());
      }

      if (lid < 0  || rid < 0 || lid == INT_MAX || rid == INT_MAX) {
        if (!rewrite.get()) {
          rewrite.reset(new DictionaryRewriter);
          rewrite->open(rewrite_file.c_str(), &config_iconv);
        }

        std::string ufeature, lfeature, rfeature;
        CHECK_DIE(rewrite->rewrite(feature, &ufeature, &lfeature, &rfeature))
            << "rewrite failed: " << feature;

        if (!cid.get()) {
          cid.reset(new ContextID);
          cid->open(left_id_file.c_str(),
                    right_id_file.c_str(), &config_iconv);
          CHECK_DIE(cid->left_size()  == matrix.left_size() &&
                    cid->right_size() == matrix.right_size())
              << "Context ID files("
              << left_id_file
              << " or "
              << right_id_file << " may be broken";
        }

        lid = cid->lid(lfeature.c_str());
        rid = cid->rid(rfeature.c_str());
      }

      CHECK_DIE(lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid))
          << "invalid ids are found lid=" << lid << " rid=" << rid;

      if (w.empty()) {
        std::cerr << "empty word is found, discard this line" << std::endl;
        continue;
      }

      if (!iconv.convert(&feature)) {
        std::cerr << "iconv conversion failed. skip this entry"
                  << std::endl;
        continue;
      }

      if (type != MECAB_UNK_DIC && !iconv.convert(&w)) {
        std::cerr << "iconv conversion failed. skip this entry"
                  << std::endl;
        continue;
      }

      if (!node_format.empty()) {
        node.surface = w.c_str();
        node.feature = feature.c_str();
        node.length  = w.size();
        node.rlength = w.size();
        node.posid   = pid;
        node.stat    = MECAB_NOR_NODE;
        lattice->set_sentence(w.c_str());
        CHECK_DIE(os.get());
        CHECK_DIE(writer.get());
        os->clear();
        CHECK_DIE(writer->writeNode(lattice.get(),
                                    node_format.c_str(),
                                    &node, &*os)) <<
            "conversion error: " << feature << " with " << node_format;
        *os << '\0';
        feature = os->str();
      }

      std::string key;
      if (!wakati) {
        key = feature + '\0';
      }

      Token* token  = new Token;
      token->lcAttr = lid;
      token->rcAttr = rid;
      token->posid  = pid;
      token->wcost = cost;
      token->feature = offset;
      token->compound = 0;
      dic.push_back(std::pair<std::string, Token*>(w, token));

      // append to output buffer
      if (!wakati) {
        fbuf.append(key.data(), key.size());
      }
      offset += key.size();

      ++num;
      ++lexsize;
    }

    std::cout << num << std::endl;
  }

  if (wakati) {
    fbuf.append("\0", 1);
  }

  std::stable_sort(dic.begin(), dic.end(),
                   pair_1st_cmp<std::string, Token *>());

  size_t bsize = 0;
  size_t idx = 0;
  std::string prev;
  std::vector<const char *> str;
  std::vector<size_t> len;
  std::vector<Darts::DoubleArray::result_type> val;

  for (size_t i = 0; i < dic.size(); ++i) {
    if (i != 0 && prev != dic[i].first) {
      str.push_back(dic[idx].first.c_str());
      len.push_back(dic[idx].first.size());
      val.push_back(bsize +(idx << 8));
      bsize = 1;
      idx = i;
    } else {
      ++bsize;
    }
    prev = dic[i].first;
  }
  str.push_back(dic[idx].first.c_str());
  len.push_back(dic[idx].first.size());
  val.push_back(bsize +(idx << 8));

  CHECK_DIE(str.size() == len.size());
  CHECK_DIE(str.size() == val.size());

  Darts::DoubleArray da;
  CHECK_DIE(da.build(str.size(), const_cast<char **>(&str[0]),
                     &len[0], &val[0], &progress_bar_darts) == 0)
      << "unkown error in building double-array";

  std::string tbuf;
  for (size_t i = 0; i < dic.size(); ++i) {
    tbuf.append(reinterpret_cast<const char*>(dic[i].second),
                sizeof(Token));
    delete dic[i].second;
  }
  dic.clear();

  // needs to be 8byte(64bit) aligned
  while (tbuf.size() % 8 != 0) {
    Token dummy;
    memset(&dummy, 0, sizeof(Token));
    tbuf.append(reinterpret_cast<const char*>(&dummy), sizeof(Token));
  }

  unsigned int dummy = 0;
  unsigned int lsize = matrix.left_size();
  unsigned int rsize = matrix.right_size();
  unsigned int dsize = da.unit_size() * da.size();
  unsigned int tsize = tbuf.size();
  unsigned int fsize = fbuf.size();

  unsigned int version = DIC_VERSION;
  char charset[32];
  std::fill(charset, charset + sizeof(charset), '\0');
  std::strncpy(charset, to.c_str(), 31);

  std::ofstream bofs(WPATH(output), std::ios::binary|std::ios::out);
  CHECK_DIE(bofs) << "permission denied: " << output;

  unsigned int magic = 0;

  // needs to be 64bit aligned
  // 10*32 = 64*5
  bofs.write(reinterpret_cast<const char *>(&magic),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&version), sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&type),    sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&lexsize), sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&lsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&rsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&dsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&tsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&fsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&dummy),   sizeof(unsigned int));

  // 32 * 8 = 64 * 4
  bofs.write(reinterpret_cast<const char *>(charset),  sizeof(charset));

  bofs.write(reinterpret_cast<const char*>(da.array()),
             da.unit_size() * da.size());
  bofs.write(const_cast<const char *>(tbuf.data()), tbuf.size());
  bofs.write(const_cast<const char *>(fbuf.data()), fbuf.size());

  // save magic id
  magic = static_cast<unsigned int>(bofs.tellp());
  magic ^= DictionaryMagicID;
  bofs.seekp(0);
  bofs.write(reinterpret_cast<const char *>(&magic), sizeof(unsigned int));

  bofs.close();

  return true;
}